

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_alignment.c
# Opt level: O0

void fsnav_ins_alignment_static(void)

{
  char *__nptr;
  double dVar1;
  ulong local_40;
  size_t j;
  size_t i;
  double n1_n;
  char *cfg_ptr;
  double t0_default;
  char cStack_10;
  char cStack_f;
  char cStack_e;
  char cStack_d;
  char cStack_c;
  char cStack_b;
  char t0_token [10];
  
  t0_default._6_1_ = 'a';
  t0_default._7_1_ = 'l';
  cStack_10 = 'i';
  cStack_f = 'g';
  cStack_e = 'n';
  cStack_d = 'm';
  cStack_c = 'e';
  cStack_b = 'n';
  t0_token[0] = 't';
  t0_token[1] = '\0';
  if (fsnav->imu != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      fsnav_ins_alignment_static::n = 0;
      fsnav_ins_alignment_static::L = (fsnav->imu->sol).L;
      __nptr = fsnav_locate_token((char *)((long)&t0_default + 6),fsnav->imu->cfg,
                                  fsnav->imu->cfglength,'=');
      if ((__nptr == (char *)0x0) ||
         (fsnav_ins_alignment_static::t0 = atof(__nptr), fsnav_ins_alignment_static::t0 <= 0.0)) {
        fsnav_ins_alignment_static::t0 = 300.0;
      }
    }
    else if ((-1 < fsnav->mode) && (fsnav->imu->t <= fsnav_ins_alignment_static::t0)) {
      (fsnav->imu->sol).L_valid = '\0';
      (fsnav->imu->sol).q_valid = '\0';
      (fsnav->imu->sol).rpy_valid = '\0';
      if ((fsnav->imu->w_valid != '\0') && (fsnav->imu->f_valid != '\0')) {
        fsnav_ins_alignment_static::n = fsnav_ins_alignment_static::n + 1;
        dVar1 = ((double)fsnav_ins_alignment_static::n - 1.0) /
                (double)fsnav_ins_alignment_static::n;
        for (j = 0; j < 3; j = j + 1) {
          fsnav_ins_alignment_static::w[j] =
               fsnav_ins_alignment_static::w[j] * dVar1 +
               fsnav->imu->w[j] / (double)fsnav_ins_alignment_static::n;
          fsnav_ins_alignment_static::f[j] =
               fsnav_ins_alignment_static::f[j] * dVar1 +
               fsnav->imu->f[j] / (double)fsnav_ins_alignment_static::n;
        }
        fsnav_linal_cross3x1
                  (fsnav_ins_alignment_static::v,fsnav_ins_alignment_static::w,
                   fsnav_ins_alignment_static::f);
        fsnav_ins_alignment_static::d[0] = fsnav_linal_vnorm(fsnav_ins_alignment_static::v,3);
        fsnav_linal_cross3x1
                  (fsnav_ins_alignment_static::vv,fsnav_ins_alignment_static::f,
                   fsnav_ins_alignment_static::v);
        fsnav_ins_alignment_static::d[1] = fsnav_linal_vnorm(fsnav_ins_alignment_static::vv,3);
        fsnav_ins_alignment_static::d[2] = fsnav_linal_vnorm(fsnav_ins_alignment_static::f,3);
      }
      for (j = 0; j < 3; j = j + 1) {
        if (fsnav_ins_alignment_static::d[j] <= 0.0) {
          return;
        }
      }
      j = 0;
      for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
        fsnav_ins_alignment_static::L[j] =
             fsnav_ins_alignment_static::v[local_40] / fsnav_ins_alignment_static::d[0];
        fsnav_ins_alignment_static::L[j + 1] =
             fsnav_ins_alignment_static::vv[local_40] / fsnav_ins_alignment_static::d[1];
        fsnav_ins_alignment_static::L[j + 2] =
             fsnav_ins_alignment_static::f[local_40] / fsnav_ins_alignment_static::d[2];
        j = j + 3;
      }
      (fsnav->imu->sol).L_valid = '\x01';
      fsnav_linal_mat2quat((fsnav->imu->sol).q,(fsnav->imu->sol).L);
      (fsnav->imu->sol).q_valid = '\x01';
      fsnav_linal_mat2rpy((fsnav->imu->sol).rpy,(fsnav->imu->sol).L);
      (fsnav->imu->sol).rpy_valid = '\x01';
      for (j = 0; j < 3; j = j + 1) {
        (fsnav->imu->sol).v[j] = 0.0;
      }
      (fsnav->imu->sol).v_valid = '\x01';
    }
  }
  return;
}

Assistant:

void fsnav_ins_alignment_static(void) {

	const char   t0_token[] = "alignment"; // alignment duration parameter name in configuration
	const double t0_default = 300;         // default alignment duration

	static double 
		w [3]	= {0,0,0},  // average angular rate measured by gyroscopes <w>
		f [3]	= {0,0,0},  // average specific force vector measured by accelerometers <f>
		v [3]	= {0,0,0},  // cross product <w> x <f>
		vv[3]	= {0,0,0},  // double cross product <f> x (<w> x <f>)
		d [3]	= {0,0,0},  // vector magnitudes
		*L	    = NULL,     // pointer to attitude matrix in solution
		t0      = -1;       // alignment duration
	static int n = 0;       // measurement counter

	char   *cfg_ptr;        // pointer to a substring in configuration
	double  n1_n;           // (n - 1)/n
	size_t  i, j;			// common index variables


	// check if imu data has been initialized
	if (fsnav->imu == NULL)
		return;

	if (fsnav->mode == 0) {		// init

		// init values
		n = 0;                // drop the counter on init
		L = fsnav->imu->sol.L; // set pointer to imu solution matrix
		// parse alignment duration from configuration string
		cfg_ptr = fsnav_locate_token(t0_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL)
			t0 = atof(cfg_ptr);		
		// if not found or invalid, set to default
		if (cfg_ptr == NULL || t0 <= 0)
			t0 = t0_default;

	}
	else if (fsnav->mode < 0) {	// terminate
		// do nothing
	}
	else						// main cycle
	{
		// check if alignment duration exceeded 
		if (fsnav->imu->t > t0)
			return;
		// drop validity flags
		fsnav->imu->sol.L_valid		= 0;
		fsnav->imu->sol.q_valid		= 0;
		fsnav->imu->sol.rpy_valid	= 0;
		// renew averages, cross products and their lengths
		if (fsnav->imu->w_valid && fsnav->imu->f_valid) {
			n++;
			n1_n = (n - 1.0)/n;
			for (i = 0; i < 3; i++) {
				w[i] = w[i]*n1_n + fsnav->imu->w[i]/n;
				f[i] = f[i]*n1_n + fsnav->imu->f[i]/n;
			}

			fsnav_linal_cross3x1(v , w, f);	d[0] = fsnav_linal_vnorm(v , 3);
			fsnav_linal_cross3x1(vv, f, v);	d[1] = fsnav_linal_vnorm(vv, 3);
											d[2] = fsnav_linal_vnorm(f , 3);
		}
		// check for singularity
		for (i = 0; i < 3; i++)
			if (d[i] <= 0) // attitude undefined
				return;
		// renew attitude matrix
		for (i = 0, j = 0; j < 3; i += 3, j++) {
			L[i + 0] = v [j]/d[0];
			L[i + 1] = vv[j]/d[1];
			L[i + 2] = f [j]/d[2];
		}
		fsnav->imu->sol.L_valid   = 1;
		// renew quaternion
		fsnav_linal_mat2quat(fsnav->imu->sol.q  , fsnav->imu->sol.L);
		fsnav->imu->sol.q_valid   = 1;
		// renew angles
		fsnav_linal_mat2rpy (fsnav->imu->sol.rpy, fsnav->imu->sol.L);
		fsnav->imu->sol.rpy_valid = 1;
		// set velocity equal to zero, as it is assumed to do so in static alignment
		for (i = 0; i < 3; i++)
			fsnav->imu->sol.v[i] = 0;
		fsnav->imu->sol.v_valid = 1;

	}

}